

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall QO_Manager::CalculateOptJoin(QO_Manager *this,int relsInJoin,int relSize)

{
  float relsInJoin_00;
  RC RVar1;
  bool bVar2;
  costElem *this_00;
  reference piVar3;
  reference this_01;
  pair<const_int,_costElem_*> local_d0;
  int local_bc;
  int local_b8;
  int indexCond;
  int indexAttr;
  float totalTuples;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> attrStats;
  float cost;
  iterator iStack_70;
  int subJoin;
  int *local_68;
  costElem *local_60;
  costElem *costTable;
  iterator it;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> relsInJoinVec;
  RC rc;
  int relSize_local;
  int relsInJoin_local;
  QO_Manager *this_local;
  
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  rc = relsInJoin;
  _relSize_local = this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  ConvertBitmapToVec(this,rc,(vector<int,_std::allocator<int>_> *)local_40);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&costTable);
  this_00 = (costElem *)operator_new(0x48);
  memset(this_00,0,0x48);
  costElem::costElem(this_00);
  this_00->cost = 3.4028235e+38;
  this_00->indexAttr = -1;
  this_00->indexCond = -1;
  local_60 = this_00;
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_40);
  costTable = (costElem *)local_68;
  while( true ) {
    iStack_70 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_40);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &costTable,&stack0xffffffffffffff90);
    if (!bVar2) break;
    cost = (float)rc;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &costTable);
    relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = RemoveRelFromBitmap(this,*piVar3,(int *)&cost);
    RVar1 = relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    if (relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ != 0) goto LAB_00125176;
    std::map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>::map
              ((map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                *)&indexAttr);
    relsInJoin_00 = cost;
    local_b8 = -1;
    local_bc = -1;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &costTable);
    relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         CalculateJoin(this,(int)relsInJoin_00,*piVar3,relSize,
                       (float *)((long)&attrStats._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                4),(float *)&indexCond,
                       (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                        *)&indexAttr,&local_b8,&local_bc);
    if (relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ == 0) {
      if (attrStats._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < local_60->cost) {
        local_60->cost = attrStats._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        std::map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>::
        clear(&local_60->attrs);
        std::map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>::
        operator=(&local_60->attrs,
                  (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                   *)&indexAttr);
        local_60->joins = (int)cost;
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &costTable);
        local_60->newRelIndex = *piVar3;
        local_60->numTuples = (float)indexCond;
        local_60->indexAttr = local_b8;
        local_60->indexCond = local_bc;
      }
      bVar2 = false;
    }
    else {
      bVar2 = true;
      this_local._4_4_ =
           relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    std::map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>::~map
              ((map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                *)&indexAttr);
    RVar1 = this_local._4_4_;
    if (bVar2) goto LAB_00125176;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&costTable);
  }
  this_01 = std::
            vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
            ::operator[](&this->optcost,(long)relSize);
  std::pair<const_int,_costElem_*>::pair<int_&,_costElem_*&,_true>(&local_d0,&rc,&local_60);
  std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>::
  insert(this_01,&local_d0);
  this_local._4_4_ = 0;
  RVar1 = this_local._4_4_;
LAB_00125176:
  this_local._4_4_ = RVar1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return this_local._4_4_;
}

Assistant:

RC QO_Manager::CalculateOptJoin(int relsInJoin, int relSize){
  RC rc = 0;
  // create a vector of these relations in the bitmap
  vector<int> relsInJoinVec;
  ConvertBitmapToVec(relsInJoin, relsInJoinVec);

  // Create a cost element, and initialize its values
  vector<int>::iterator it;
  costElem *costTable = new costElem();
  costTable->cost = FLT_MAX;
  costTable->indexAttr = -1;
  costTable->indexCond = -1;
  // iterate through all ways of removing a relation a
  for(it = relsInJoinVec.begin(); it != relsInJoinVec.end(); ++it){
    int subJoin = relsInJoin;
    if((rc = RemoveRelFromBitmap(*it, subJoin)))
      return (rc);

    float cost;
    map<int, attrStat> attrStats;
    float totalTuples;
    int indexAttr = -1;
    int indexCond = -1;
    // Calculate the a join (S-a)
    if((rc = CalculateJoin(subJoin, *it, relSize, cost, totalTuples, attrStats, indexAttr, indexCond)))
      return (rc);
    // if the cost is the smallest so far, update all values
    if(cost < costTable->cost){ 
      costTable->cost = cost;
      costTable->attrs.clear();
      costTable->attrs = attrStats;
      costTable->joins = subJoin;
      costTable->newRelIndex = *it;
      costTable->numTuples = totalTuples;
      costTable->indexAttr = indexAttr;
      costTable->indexCond = indexCond;
    }
  }
  // insert the costElem as the optimal way of arriving
  // at this join
  optcost[relSize].insert({relsInJoin, costTable});

  return (0);
}